

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

RootSymbol * __thiscall
slang::ast::Compilation::getRoot(Compilation *this,bool skipDefParamsAndBinds)

{
  anon_class_1_0_00000001 *paVar1;
  pointer *pppSVar2;
  size_t *psVar3;
  group_type_pointer pgVar4;
  group_type_pointer pgVar5;
  group_type_pointer pgVar6;
  value_type_pointer ppVar7;
  group_type_pointer pgVar8;
  group_type_pointer pgVar9;
  byte bVar10;
  undefined4 uVar11;
  pointer pbVar12;
  iterator __position;
  size_t sVar13;
  char *pcVar14;
  group_type_pointer pgVar15;
  value_type_pointer ppVar16;
  pointer ppSVar17;
  Symbol *pSVar18;
  pointer __n;
  pointer pcVar19;
  value_type_pointer ppVar20;
  pointer ppCVar21;
  pointer ppCVar22;
  size_t sVar23;
  _Head_base<1UL,_const_slang::ast::Scope_*,_false> _Var24;
  group_type_pointer pgVar25;
  size_type sVar26;
  size_t sVar27;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __first;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __last;
  SymbolMap *pSVar28;
  group_type_pointer pgVar29;
  DefinitionSymbol *pDVar30;
  SyntaxNode *pSVar31;
  group_type_pointer pgVar32;
  value_type_pointer ppVar33;
  pointer ppDVar34;
  pointer ppCVar35;
  pointer ppCVar36;
  uint uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  DefinitionLookupResult result;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  string_view arg;
  string_view arg_00;
  basic_string_view<char,_std::char_traits<char>_> *pbVar48;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *ptVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  Symbol *pSVar52;
  bool bVar53;
  int iVar55;
  anon_class_1_0_00000001 *paVar56;
  bool bVar54;
  void *pvVar57;
  pointer ppSVar58;
  ParameterDecl *pPVar59;
  SourceLibrary *pSVar60;
  uint64_t uVar61;
  SourceLibrary *pSVar62;
  anon_class_1_0_00000001 *paVar63;
  Diagnostic *pDVar64;
  char_pointer puVar65;
  pointer ppVar66;
  InstanceSymbol *pIVar67;
  undefined4 extraout_var;
  value_type_pointer ppVar68;
  Scope *pSVar69;
  value_type_pointer pbVar70;
  value_type *elements_4;
  long lVar71;
  Symbol *pSVar72;
  table_element_pointer ppVar73;
  table_element_pointer extraout_RDX;
  table_element_pointer extraout_RDX_00;
  table_element_pointer ppVar74;
  table_element_pointer extraout_RDX_01;
  table_element_pointer ppVar75;
  table_element_pointer extraout_RDX_02;
  table_element_pointer extraout_RDX_03;
  table_element_pointer extraout_RDX_04;
  anon_class_1_0_00000001 *extraout_RDX_05;
  table_element_pointer extraout_RDX_07;
  anon_class_1_0_00000001 *extraout_RDX_09;
  table_element_pointer extraout_RDX_11;
  table_element_pointer ppVar76;
  table_element_pointer extraout_RDX_13;
  table_element_pointer extraout_RDX_14;
  HierarchyOverrideNode *pHVar77;
  table_element_pointer extraout_RDX_15;
  table_element_pointer extraout_RDX_16;
  table_element_pointer extraout_RDX_17;
  size_t extraout_RDX_18;
  uint uVar78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *libName;
  pointer pbVar79;
  ulong uVar80;
  char_pointer puVar81;
  long lVar82;
  undefined1 *puVar83;
  pointer ppDVar84;
  value_type_pointer ppVar85;
  pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange> *ppVar86;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  _Var87;
  ParameterDecl *pPVar88;
  group_type_pointer pgVar89;
  value_type_pointer in_R8;
  value_type *elements_5;
  ulong uVar90;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __i_1;
  ulong uVar91;
  ConfigBlockSymbol *this_00;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __last_00;
  pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode> *ppVar92;
  ulong uVar93;
  value_type_pointer unaff_R13;
  value_type_pointer __u;
  __normal_iterator<const_slang::ast::DefinitionSymbol_**,_std::vector<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>_>
  __lasti;
  ulong uVar94;
  SourceLibrary *pSVar95;
  ConfigBlockSymbol *pCVar96;
  pointer pTVar97;
  char_pointer puVar98;
  char_pointer puVar99;
  RootSymbol *pRVar100;
  TopCell *cell;
  string_view *psVar101;
  pointer ppCVar102;
  pointer pTVar103;
  table_element_pointer pbVar104;
  pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange> *ppVar105;
  value_type_pointer ppVar106;
  uchar uVar107;
  uchar uVar118;
  uchar uVar119;
  uchar uVar120;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_00;
  iterator iVar128;
  iterator iVar129;
  iterator iVar130;
  string_view sVar131;
  string_view name;
  _Val_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_01;
  _Val_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_02;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_03;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_04;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_05;
  _Iter_comp_iter<(lambda_at__usr_lib_gcc_x86_64_linux_gnu_11_____________include_c___11_bits_ranges_algo_h:51:9)>
  __comp_06;
  value_type *elements_1;
  ParameterDecl *param;
  value_type *elements_2;
  anon_class_24_3_d9e6786c tryAddTop;
  value_type *elements;
  flat_hash_map<std::string_view,_const_ConstantValue_*> cliOverrides;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>,_const_slang::syntax::DeclaratorSyntax_*const_&,_void>
  x;
  SmallVector<const_slang::ast::InstanceSymbol_*,_5UL> topList;
  SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
  topDefs;
  value_type_pointer local_2a8;
  value_type_pointer local_298;
  undefined1 local_278 [16];
  undefined1 local_248 [16];
  basic_string_view<char,_std::char_traits<char>_> local_238;
  undefined1 local_228 [16];
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
  *local_210;
  undefined1 local_208 [16];
  value_type_pointer local_1f8;
  undefined1 local_1f0 [16];
  Compilation *local_1e0;
  size_t local_1d8;
  value_type_pointer local_1d0;
  value_type_pointer local_1c8;
  undefined1 local_1c0 [24];
  value_type_pointer ppStack_1a8;
  anon_class_1_0_00000001 *local_1a0;
  size_t local_198;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_190;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_178;
  DefinitionSymbol *local_170;
  ConfigBlockSymbol *pCStack_168;
  ConfigRule *local_160;
  undefined1 local_158 [24];
  SourceRange local_140;
  Symbol *local_130;
  InstanceSymbol *local_f8;
  InstanceSymbol *local_f0;
  __extent_storage<18446744073709551615UL> local_e8;
  InstanceBodySymbol *local_e0;
  undefined1 local_d8 [8];
  anon_class_1_0_00000001 *paStack_d0;
  char local_c8 [8];
  char local_c0 [16];
  Symbol *local_b0;
  undefined1 auStack_a8 [16];
  SmallVector<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>,_2UL>
  local_98;
  table_element_pointer extraout_RDX_06;
  table_element_pointer extraout_RDX_08;
  table_element_pointer extraout_RDX_10;
  table_element_pointer extraout_RDX_12;
  
  if (this->finalized == true) {
    pRVar100 = (this->root)._M_t.
               super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
               .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  }
  else {
    std::vector<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>::
    reserve(&this->defaultLiblist,
            (long)(this->options).defaultLiblist.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->options).defaultLiblist.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
    pbVar79 = (this->options).defaultLiblist.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar12 = (this->options).defaultLiblist.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar79 != pbVar12) {
      do {
        sVar131._M_str = (pbVar79->_M_dataplus)._M_p;
        sVar131._M_len = pbVar79->_M_string_length;
        local_158._0_8_ = getSourceLibrary(this,sVar131);
        if ((DefinitionSymbol *)local_158._0_8_ != (DefinitionSymbol *)0x0) {
          __position._M_current =
               (this->defaultLiblist).
               super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->defaultLiblist).
              super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<slang::SourceLibrary_const*,std::allocator<slang::SourceLibrary_const*>>::
            _M_realloc_insert<slang::SourceLibrary_const*const&>
                      ((vector<slang::SourceLibrary_const*,std::allocator<slang::SourceLibrary_const*>>
                        *)&this->defaultLiblist,__position,(SourceLibrary **)local_158);
          }
          else {
            *__position._M_current = (SourceLibrary *)local_158._0_8_;
            pppSVar2 = &(this->defaultLiblist).
                        super__Vector_base<const_slang::SourceLibrary_*,_std::allocator<const_slang::SourceLibrary_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppSVar2 = *pppSVar2 + 1;
          }
        }
        pbVar79 = pbVar79 + 1;
      } while (pbVar79 != pbVar12);
    }
    local_1c0._0_8_ = 0x3f;
    local_1c0._8_8_ = (value_type_pointer)0x1;
    stack0xfffffffffffffe50 = ZEXT816(0x49b460);
    paVar63 = (anon_class_1_0_00000001 *)0x0;
    local_198 = 0;
    local_1a0 = paVar63;
    parseParamOverrides(this,(flat_hash_map<std::string_view,_const_ConstantValue_*> *)local_1c0);
    if (!skipDefParamsAndBinds) {
      paVar63 = (anon_class_1_0_00000001 *)
                (this->syntaxTrees).
                super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (paVar56 = (anon_class_1_0_00000001 *)
                     (this->syntaxTrees).
                     super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; paVar56 != paVar63;
          paVar56 = paVar56 + 0x10) {
        if ((*(char *)(*(long *)(*(long *)paVar56 + 0x158) + 0xd0) != '\0') ||
           (*(char *)(*(long *)(*(long *)paVar56 + 0x158) + 0xd1) == '\x01')) {
          resolveDefParamsAndBinds(this);
          break;
        }
      }
    }
    this->finalizing = true;
    local_98.
    super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
    .data_ = (pointer)local_98.
                      super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                      .firstElement;
    local_98.
    super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
    .len = 0;
    local_98.
    super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
    .cap = 2;
    if ((this->options).topModules.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size == 0) {
      iVar130 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                ::begin(&(this->definitionMap).table_);
      ppVar73 = iVar130.p_;
      if (ppVar73 != (table_element_pointer)0x0) {
        ppVar76 = ppVar73;
LAB_002e5009:
        pRVar100 = (this->root)._M_t.
                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        pSVar69 = &pRVar100->super_Scope;
        if (pRVar100 == (RootSymbol *)0x0) {
          pSVar69 = (Scope *)0x0;
        }
        if ((ppVar76->first).
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
            super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl == pSVar69) {
          ppSVar17 = (ppVar76->second).first.
                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppSVar58 = (ppVar76->second).first.
                          super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; puVar98 = iVar130.pc_,
              ppSVar58 != ppSVar17; ppSVar58 = ppSVar58 + 1) {
            pDVar30 = (DefinitionSymbol *)*ppSVar58;
            if ((*(int *)&((_Alloc_hider *)&(pDVar30->super_Symbol).kind)->_M_p == 2) &&
               (pDVar30->sourceLibrary->isDefault == true)) {
              uVar61 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)&this->globalInstantiations,&(pDVar30->super_Symbol).name);
              uVar94 = uVar61 >> ((byte)(this->globalInstantiations).table_.
                                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                                        .arrays.groups_size_index & 0x3f);
              in_R8 = (value_type_pointer)
                      (this->globalInstantiations).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                      .arrays.groups_;
              uVar11 = (&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         match_word(unsigned_long)::word)[uVar61 & 0xff];
              auVar123._4_4_ = uVar11;
              auVar123._0_4_ = uVar11;
              auVar123._8_4_ = uVar11;
              auVar123._12_4_ = uVar11;
              pbVar70 = (this->globalInstantiations).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                        .arrays.elements_;
              ppVar73 = (table_element_pointer)
                        (this->globalInstantiations).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                        .arrays.groups_size_mask;
              ppVar74 = (table_element_pointer)0x0;
              local_228._0_8_ = pbVar70;
              do {
                pbVar48 = &in_R8->first + uVar94;
                uVar107 = (uchar)uVar11;
                auVar114[0] = -((uchar)pbVar48->_M_len == uVar107);
                uVar118 = (uchar)((uint)uVar11 >> 8);
                auVar114[1] = -(*(uchar *)((long)&pbVar48->_M_len + 1) == uVar118);
                uVar119 = (uchar)((uint)uVar11 >> 0x10);
                auVar114[2] = -(*(uchar *)((long)&pbVar48->_M_len + 2) == uVar119);
                uVar120 = (uchar)((uint)uVar11 >> 0x18);
                auVar114[3] = -(*(uchar *)((long)&pbVar48->_M_len + 3) == uVar120);
                auVar114[4] = -(*(uchar *)((long)&pbVar48->_M_len + 4) == uVar107);
                auVar114[5] = -(*(uchar *)((long)&pbVar48->_M_len + 5) == uVar118);
                auVar114[6] = -(*(uchar *)((long)&pbVar48->_M_len + 6) == uVar119);
                auVar114[7] = -(*(uchar *)((long)&pbVar48->_M_len + 7) == uVar120);
                auVar114[8] = -(*(uchar *)&pbVar48->_M_str == uVar107);
                auVar114[9] = -(((slot_type *)((long)&pbVar48->_M_str + 1))->n == uVar118);
                auVar114[10] = -(((slot_type *)((long)&pbVar48->_M_str + 2))->n == uVar119);
                auVar114[0xb] = -(((slot_type *)((long)&pbVar48->_M_str + 3))->n == uVar120);
                auVar114[0xc] = -(((slot_type *)((long)&pbVar48->_M_str + 4))->n == uVar107);
                auVar114[0xd] = -(((slot_type *)((long)&pbVar48->_M_str + 5))->n == uVar118);
                auVar114[0xe] = -(((slot_type *)((long)&pbVar48->_M_str + 6))->n == uVar119);
                auVar114[0xf] = -(((slot_type *)((long)&pbVar48->_M_str + 7))->n == uVar120);
                uVar78 = (uint)(ushort)((ushort)(SUB161(auVar114 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar114 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar114 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar114 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar114 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar114 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar114 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar114 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar114 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar114 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar114 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar114 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar114 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar114 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar114 >> 0x77,0) & 1) << 0xe);
                if (uVar78 != 0) {
                  local_208._0_8_ = in_R8;
                  sVar13 = (pDVar30->super_Symbol).name._M_len;
                  pvVar57 = (void *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                      *)&(pDVar30->super_Symbol).name._M_str)->_M_allocated_capacity
                  ;
                  ppVar75 = ppVar73;
                  do {
                    iVar55 = 0;
                    if (uVar78 != 0) {
                      for (; (uVar78 >> iVar55 & 1) == 0; iVar55 = iVar55 + 1) {
                      }
                    }
                    bVar53 = sVar13 == *(size_t *)
                                        ((long)&pbVar70[uVar94 * 0xf]._M_len +
                                        (ulong)(uint)(iVar55 << 4));
                    lVar71 = (long)&pbVar70[uVar94 * 0xf]._M_len + (ulong)(uint)(iVar55 << 4);
                    ppVar75 = (table_element_pointer)
                              CONCAT71((int7)((ulong)ppVar75 >> 8),!bVar53 || sVar13 == 0);
                    if (bVar53 && sVar13 != 0) {
                      iVar55 = bcmp(pvVar57,*(void **)(lVar71 + 8),sVar13);
                      bVar53 = iVar55 == 0;
                      ppVar75 = extraout_RDX_02;
                    }
                    local_248 = auVar123;
                    if (bVar53) {
                      local_278._0_8_ = lVar71;
                      goto LAB_002e5274;
                    }
                    uVar78 = uVar78 - 1 & uVar78;
                  } while (uVar78 != 0);
                  in_R8 = (value_type_pointer)local_208._0_8_;
                }
                if ((((slot_type *)((long)&(&in_R8->first)[uVar94]._M_str + 7))->n &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[(uint)uVar61 & 7]) == 0) {
                  auVar44._8_8_ = 0;
                  auVar44._0_8_ = local_278._8_8_;
                  local_278 = auVar44 << 0x40;
                  ppVar75 = ppVar73;
                  goto LAB_002e5274;
                }
                ptVar49 = &ppVar74->first;
                ppVar74 = (table_element_pointer)
                          ((long)&(ppVar74->first).
                                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                                  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>.
                                  _M_head_impl + 1);
                uVar94 = (long)&(ptVar49->
                                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                ).super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                                super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl
                         + uVar94 + 1 & (ulong)ppVar73;
                pbVar70 = (value_type_pointer)local_228._0_8_;
              } while (ppVar74 <= ppVar73);
              auVar43._8_8_ = 0;
              auVar43._0_8_ = local_278._8_8_;
              local_278 = auVar43 << 0x40;
              ppVar75 = ppVar73;
LAB_002e5274:
              iVar130.p_ = ppVar75;
              iVar130.pc_ = puVar98;
              if (local_278._0_8_ == 0) {
                if (((pDVar30->syntaxTree == (SyntaxTree *)0x0) ||
                    (pDVar30->syntaxTree->isLibraryUnit == false)) &&
                   ((pDVar30->definitionKind & ~Program) == Module)) {
                  sVar26 = (pDVar30->parameters).
                           super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.len;
                  bVar53 = sVar26 == 0;
                  if (!bVar53) {
                    pPVar88 = (pDVar30->parameters).
                              super_SmallVectorBase<slang::ast::DefinitionSymbol::ParameterDecl>.
                              data_;
                    pPVar59 = pPVar88 + sVar26;
                    do {
                      bVar54 = DefinitionSymbol::ParameterDecl::hasDefault(pPVar88);
                      if (!bVar54) {
                        if (pPVar88->isTypeParam != false) break;
                        uVar61 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                                 operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                             *)local_1c0,&pPVar88->name);
                        uVar80 = uVar61 >> ((byte)local_1c0[0] & 0x3f);
                        uVar50 = local_1c0._16_8_;
                        uVar11 = (&boost::unordered::detail::foa::
                                   group15<boost::unordered::detail::foa::plain_integral>::
                                   match_word(unsigned_long)::word)[uVar61 & 0xff];
                        auVar124._4_4_ = uVar11;
                        auVar124._0_4_ = uVar11;
                        auVar124._8_4_ = uVar11;
                        auVar124._12_4_ = uVar11;
                        uVar94 = (ulong)((uint)uVar61 & 7);
                        local_1c8 = ppStack_1a8;
                        local_1f8 = (value_type_pointer)0x0;
                        ppVar68 = (value_type_pointer)local_1c0._8_8_;
                        do {
                          local_210 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                                       *)(uVar80 * 0x10);
                          pgVar5 = (group_type_pointer)(uVar50 + uVar80 * 0x10);
                          auVar115[0] = -(pgVar5->m[0].n == auVar124[0]);
                          auVar115[1] = -(pgVar5->m[1].n == auVar124[1]);
                          auVar115[2] = -(pgVar5->m[2].n == auVar124[2]);
                          auVar115[3] = -(pgVar5->m[3].n == auVar124[3]);
                          auVar115[4] = -(pgVar5->m[4].n == auVar124[4]);
                          auVar115[5] = -(pgVar5->m[5].n == auVar124[5]);
                          auVar115[6] = -(pgVar5->m[6].n == auVar124[6]);
                          auVar115[7] = -(pgVar5->m[7].n == auVar124[7]);
                          auVar115[8] = -(pgVar5->m[8].n == auVar124[8]);
                          auVar115[9] = -(pgVar5->m[9].n == auVar124[9]);
                          auVar115[10] = -(pgVar5->m[10].n == auVar124[10]);
                          auVar115[0xb] = -(pgVar5->m[0xb].n == auVar124[0xb]);
                          auVar115[0xc] = -(pgVar5->m[0xc].n == auVar124[0xc]);
                          auVar115[0xd] = -(pgVar5->m[0xd].n == auVar124[0xd]);
                          auVar115[0xe] = -(pgVar5->m[0xe].n == auVar124[0xe]);
                          auVar115[0xf] = -(pgVar5->m[0xf].n == auVar124[0xf]);
                          uVar78 = (uint)(ushort)((ushort)(SUB161(auVar115 >> 7,0) & 1) |
                                                  (ushort)(SUB161(auVar115 >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar115 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar115 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar115 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar115 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar115 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar115 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar115 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar115 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar115 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar115 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar115 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar115 >> 0x6f,0) & 1) << 0xd |
                                                 (ushort)(SUB161(auVar115 >> 0x77,0) & 1) << 0xe);
                          if (uVar78 != 0) {
                            in_R8 = local_1c8 + uVar80 * 0xf;
                            sVar13 = (pPVar88->name)._M_len;
                            pcVar14 = (pPVar88->name)._M_str;
                            local_228._0_8_ = uVar94;
                            local_208 = auVar124;
                            local_1d0 = ppVar68;
                            do {
                              uVar37 = 0;
                              if (uVar78 != 0) {
                                for (; (uVar78 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                                }
                              }
                              ppVar68 = in_R8 + uVar37;
                              sVar27 = (ppVar68->first)._M_len;
                              bVar54 = sVar13 == sVar27;
                              if ((sVar13 != 0) && (sVar13 == sVar27)) {
                                iVar55 = bcmp(pcVar14,(ppVar68->first)._M_str,sVar13);
                                bVar54 = iVar55 == 0;
                                uVar94 = local_228._0_8_;
                                auVar124 = local_208;
                              }
                              if (bVar54) {
                                local_248._0_8_ = ppVar68;
                                goto LAB_002e54c0;
                              }
                              uVar78 = uVar78 - 1 & uVar78;
                              ppVar68 = local_1d0;
                            } while (uVar78 != 0);
                          }
                          in_R8 = (value_type_pointer)(local_210 + uVar50);
                          if ((((slot_type *)((long)&(in_R8->first)._M_str + 7))->n &
                              (&boost::unordered::detail::foa::
                                group15<boost::unordered::detail::foa::plain_integral>::
                                is_not_overflowed(unsigned_long)::shift)[uVar94]) == 0) break;
                          in_R8 = (value_type_pointer)((long)&(local_1f8->first)._M_len + 1);
                          uVar80 = (ulong)((long)&(local_1f8->first)._M_len + uVar80 + 1) &
                                   (ulong)ppVar68;
                          local_1f8 = in_R8;
                        } while (in_R8 <= ppVar68);
                        auVar45._8_8_ = 0;
                        auVar45._0_8_ = local_248._8_8_;
                        local_248 = auVar45 << 0x40;
LAB_002e54c0:
                        if (local_248._0_8_ == 0) break;
                      }
                      pPVar88 = pPVar88 + 1;
                      bVar53 = pPVar88 == pPVar59;
                    } while (!bVar53);
                  }
                  if (!bVar53) goto LAB_002e5523;
                  local_158._8_8_ = 0;
                  local_158._16_8_ = (char *)0x0;
                  local_140.startLoc = (SourceLocation)0x0;
                  local_140.endLoc = (SourceLocation)0x0;
                  local_158._0_8_ = pDVar30;
                  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>>
                  ::
                  emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>>
                            ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>>
                              *)&local_98,
                             (pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>
                              *)local_158);
                  ppVar73 = extraout_RDX_03;
                }
                else {
LAB_002e5523:
                  local_158._0_8_ = pDVar30;
                  std::
                  vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                  ::emplace_back<slang::ast::DefinitionSymbol_const*>
                            ((vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                              *)&this->unreferencedDefs,(DefinitionSymbol **)local_158);
                  ppVar73 = extraout_RDX_04;
                }
                iVar130.p_ = ppVar73;
              }
            }
          }
        }
        ppVar73 = iVar130.p_;
        puVar65 = iVar130.pc_;
        puVar98 = puVar65 + 2;
        do {
          puVar99 = puVar98;
          ppVar76 = ppVar76 + 1;
          if (((uint)puVar65 & 0xf) == 0xe) goto LAB_002e5554;
          bVar10 = puVar99[-1];
          paVar63 = (anon_class_1_0_00000001 *)(ulong)bVar10;
          puVar65 = puVar65 + 1;
          puVar98 = puVar99 + 1;
        } while (bVar10 == 0);
        puVar99 = puVar99 + -1;
        if (bVar10 == 1) {
          ppVar76 = (table_element_pointer)0x0;
        }
        goto LAB_002e5056;
      }
    }
    else {
      local_1f0._0_8_ = local_158;
      local_e8._M_extent_value = 0x3f;
      local_e0 = (InstanceBodySymbol *)0x1;
      _local_d8 = ZEXT816(0x49b460);
      auVar41 = _local_d8;
      paStack_d0 = (anon_class_1_0_00000001 *)0x0;
      local_c8[0] = '\0';
      local_c8[1] = '\0';
      local_c8[2] = '\0';
      local_c8[3] = '\0';
      local_c8[4] = '\0';
      local_c8[5] = '\0';
      local_c8[6] = '\0';
      local_c8[7] = '\0';
      local_c0[0] = '\0';
      local_c0[1] = '\0';
      local_c0[2] = '\0';
      local_c0[3] = '\0';
      local_c0[4] = '\0';
      local_c0[5] = '\0';
      local_c0[6] = '\0';
      local_c0[7] = '\0';
      local_1f0._8_8_ = &local_98;
      paVar63 = paStack_d0;
      local_1e0 = this;
      local_f8 = (InstanceSymbol *)local_1f0._0_8_;
      local_f0 = (InstanceSymbol *)local_1f0._0_8_;
      _local_d8 = auVar41;
      iVar128 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::begin(&(this->options).topModules.table_);
      if (iVar128.p_ != (table_element_pointer)0x0) {
        local_178 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                    &this->configBlocks;
LAB_002e4286:
        psVar101 = iVar128.p_;
        sVar13 = psVar101->_M_len;
        pcVar14 = psVar101->_M_str;
        arg_00 = *psVar101;
        arg = *psVar101;
        sVar131 = *psVar101;
        local_238._M_len = sVar13;
        local_238._M_str = pcVar14;
        if (sVar13 == 0) {
          uVar94 = 0xffffffffffffffff;
        }
        else {
          pvVar57 = memchr(pcVar14,0x2e,sVar13);
          uVar94 = -(ulong)(pvVar57 == (void *)0x0) | (long)pvVar57 - (long)pcVar14;
        }
        bVar53 = true;
        if (uVar94 == 0xffffffffffffffff) {
          pSVar60 = (SourceLibrary *)0x0;
          bVar53 = true;
        }
        else {
          uVar80 = uVar94;
          if (sVar13 < uVar94) {
            uVar80 = sVar13;
          }
          name._M_str = pcVar14;
          name._M_len = uVar80;
          pSVar60 = getSourceLibrary(this,name);
          if (pSVar60 == (SourceLibrary *)0x0) {
            pDVar64 = Scope::addDiag(&((this->root)._M_t.
                                       super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                       .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                      _M_head_impl)->super_Scope,(DiagCode)0x10000d,
                                     (SourceLocation)0xffffffffffffffff);
            Diagnostic::operator<<(pDVar64,sVar131);
            pSVar60 = (SourceLibrary *)0x0;
            bVar53 = false;
          }
          else {
            if (local_238._M_len <= uVar94) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr");
            }
            local_238._M_len = local_238._M_len - (uVar94 + 1);
            local_238._M_str = local_238._M_str + uVar94 + 1;
          }
        }
        if (bVar53) {
          if ((local_238._M_len < 7) ||
             (*(int *)(local_238._M_str + (local_238._M_len - 4)) != 0x6769666e ||
              *(int *)(local_238._M_str + (local_238._M_len - 7)) != 0x6e6f633a)) {
            pRVar100 = (this->root)._M_t.
                       super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                       .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
            local_190.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
            _M_head_impl._M_len = local_238._M_len;
            local_190.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
            _M_head_impl._M_str = local_238._M_str;
            local_190.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
            super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                 (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)&pRVar100->super_Scope;
            if (pRVar100 == (RootSymbol *)0x0) {
              local_190.
              super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
              .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
              super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                   (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)(Scope *)0x0;
            }
            local_1d8 = 0;
            slang::detail::hashing::
            HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
            ::apply(&local_1d8,&local_190);
            auVar41._8_8_ = 0;
            auVar41._0_8_ = local_1d8;
            uVar91 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar41,8) ^
                     SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar41,0);
            uVar94 = uVar91 >> ((byte)(this->definitionMap).table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                                      .arrays.groups_size_index & 0x3f);
            uVar11 = (&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word)[uVar91 & 0xff];
            auVar121._4_4_ = uVar11;
            auVar121._0_4_ = uVar11;
            auVar121._8_4_ = uVar11;
            auVar121._12_4_ = uVar11;
            uVar80 = 0;
            do {
              pgVar15 = (this->definitionMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                        .arrays.groups_;
              local_228._0_8_ = uVar94 * 0x10;
              pgVar4 = pgVar15 + uVar94;
              uVar107 = (uchar)uVar11;
              auVar108[0] = -(pgVar4->m[0].n == uVar107);
              uVar118 = (uchar)((uint)uVar11 >> 8);
              auVar108[1] = -(pgVar4->m[1].n == uVar118);
              uVar119 = (uchar)((uint)uVar11 >> 0x10);
              auVar108[2] = -(pgVar4->m[2].n == uVar119);
              uVar120 = (uchar)((uint)uVar11 >> 0x18);
              auVar108[3] = -(pgVar4->m[3].n == uVar120);
              auVar108[4] = -(pgVar4->m[4].n == uVar107);
              auVar108[5] = -(pgVar4->m[5].n == uVar118);
              auVar108[6] = -(pgVar4->m[6].n == uVar119);
              auVar108[7] = -(pgVar4->m[7].n == uVar120);
              auVar108[8] = -(pgVar4->m[8].n == uVar107);
              auVar108[9] = -(pgVar4->m[9].n == uVar118);
              auVar108[10] = -(pgVar4->m[10].n == uVar119);
              auVar108[0xb] = -(pgVar4->m[0xb].n == uVar120);
              auVar108[0xc] = -(pgVar4->m[0xc].n == uVar107);
              auVar108[0xd] = -(pgVar4->m[0xd].n == uVar118);
              auVar108[0xe] = -(pgVar4->m[0xe].n == uVar119);
              auVar108[0xf] = -(pgVar4->m[0xf].n == uVar120);
              uVar78 = (uint)(ushort)((ushort)(SUB161(auVar108 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar108 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar108 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar108 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar108 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar108 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar108 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar108 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar108 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar108 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar108 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar108 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar108 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar108 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar108 >> 0x77,0) & 1) << 0xe);
              if (uVar78 != 0) {
                ppVar16 = (this->definitionMap).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                          .arrays.elements_;
                do {
                  uVar37 = 0;
                  if (uVar78 != 0) {
                    for (; (uVar78 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                    }
                  }
                  __u = ppVar16 + uVar94 * 0xf + (ulong)uVar37;
                  bVar53 = std::
                           __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                           ::__eq(&local_190,&__u->first);
                  local_278 = auVar121;
                  if (bVar53) goto LAB_002e44bb;
                  uVar78 = uVar78 - 1 & uVar78;
                } while (uVar78 != 0);
                __u = unaff_R13;
                if (bVar53) goto LAB_002e44bb;
              }
              if ((pgVar15->m[local_228._0_8_ + 0xf].n &
                  (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    is_not_overflowed(unsigned_long)::shift)[(uint)uVar91 & 7]) == 0) break;
              uVar93 = (this->definitionMap).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                       .arrays.groups_size_mask;
              lVar71 = uVar94 + uVar80;
              uVar80 = uVar80 + 1;
              uVar94 = lVar71 + 1U & uVar93;
            } while (uVar80 <= uVar93);
            __u = (value_type_pointer)0x0;
LAB_002e44bb:
            if (__u == (value_type_pointer)0x0) {
LAB_002e47ed:
              iVar55 = 0;
            }
            else {
              ppSVar58 = (__u->second).first.
                         super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppSVar17 = (__u->second).first.
                         super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              if (ppSVar58 == ppSVar17) {
                pSVar72 = (Symbol *)0x0;
              }
              else {
                pSVar72 = (Symbol *)0x0;
                do {
                  pSVar18 = *ppSVar58;
                  iVar55 = 0x11;
                  pSVar52 = pSVar72;
                  if (pSVar18->kind == Definition) {
                    pSVar62 = (SourceLibrary *)pSVar18[0xb].name._M_str;
                    iVar55 = 0x10;
                    pSVar52 = pSVar18;
                    if ((pSVar62 != pSVar60) &&
                       ((pSVar60 != (SourceLibrary *)0x0 || (pSVar62->isDefault == false)))) {
                      iVar55 = 0;
                      pSVar52 = pSVar72;
                    }
                  }
                  pSVar72 = pSVar52;
                } while (((iVar55 == 0x11) || (iVar55 == 0)) &&
                        (ppSVar58 = ppSVar58 + 1, ppSVar58 != ppSVar17));
              }
              if (pSVar72 == (Symbol *)0x0) {
                iVar55 = 0;
              }
              else {
                if ((pSVar72[1].name._M_len & 0xfffffffd) == 0) {
                  bVar53 = pSVar72[1].nextInScope == (Symbol *)0x0;
                  if (!bVar53) {
                    pPVar88 = (ParameterDecl *)pSVar72[1].parentScope;
                    pPVar59 = pPVar88 + (long)pSVar72[1].nextInScope;
                    pSVar62 = pSVar60;
                    do {
                      bVar54 = DefinitionSymbol::ParameterDecl::hasDefault(pPVar88);
                      if (!bVar54) {
                        if (pPVar88->isTypeParam != false) break;
                        uVar61 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                                 operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                             *)local_1c0,&pPVar88->name);
                        ppVar85 = (value_type_pointer)(uVar61 >> ((byte)local_1c0[0] & 0x3f));
                        uVar50 = local_1c0._16_8_;
                        uVar11 = (&boost::unordered::detail::foa::
                                   group15<boost::unordered::detail::foa::plain_integral>::
                                   match_word(unsigned_long)::word)[uVar61 & 0xff];
                        auVar122._4_4_ = uVar11;
                        auVar122._0_4_ = uVar11;
                        auVar122._8_4_ = uVar11;
                        auVar122._12_4_ = uVar11;
                        local_1c8 = ppStack_1a8;
                        in_R8 = (value_type_pointer)0x0;
                        ppVar68 = (value_type_pointer)local_1c0._8_8_;
                        do {
                          ppVar7 = local_1c8;
                          local_210 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                                       *)((long)ppVar85 * 0x10);
                          pgVar5 = (group_type_pointer)(uVar50 + ppVar85 * 0x10);
                          auVar109[0] = -(pgVar5->m[0].n == auVar122[0]);
                          auVar109[1] = -(pgVar5->m[1].n == auVar122[1]);
                          auVar109[2] = -(pgVar5->m[2].n == auVar122[2]);
                          auVar109[3] = -(pgVar5->m[3].n == auVar122[3]);
                          auVar109[4] = -(pgVar5->m[4].n == auVar122[4]);
                          auVar109[5] = -(pgVar5->m[5].n == auVar122[5]);
                          auVar109[6] = -(pgVar5->m[6].n == auVar122[6]);
                          auVar109[7] = -(pgVar5->m[7].n == auVar122[7]);
                          auVar109[8] = -(pgVar5->m[8].n == auVar122[8]);
                          auVar109[9] = -(pgVar5->m[9].n == auVar122[9]);
                          auVar109[10] = -(pgVar5->m[10].n == auVar122[10]);
                          auVar109[0xb] = -(pgVar5->m[0xb].n == auVar122[0xb]);
                          auVar109[0xc] = -(pgVar5->m[0xc].n == auVar122[0xc]);
                          auVar109[0xd] = -(pgVar5->m[0xd].n == auVar122[0xd]);
                          auVar109[0xe] = -(pgVar5->m[0xe].n == auVar122[0xe]);
                          auVar109[0xf] = -(pgVar5->m[0xf].n == auVar122[0xf]);
                          uVar78 = (uint)(ushort)((ushort)(SUB161(auVar109 >> 7,0) & 1) |
                                                  (ushort)(SUB161(auVar109 >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar109 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar109 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar109 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar109 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar109 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar109 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar109 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar109 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar109 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar109 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar109 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar109 >> 0x6f,0) & 1) << 0xd |
                                                 (ushort)(SUB161(auVar109 >> 0x77,0) & 1) << 0xe);
                          local_1f8 = ppVar85;
                          if (uVar78 != 0) {
                            __n = (pointer)(pPVar88->name)._M_len;
                            local_208._0_8_ = (pPVar88->name)._M_str;
                            local_228 = auVar122;
                            local_1d0 = ppVar68;
                            do {
                              local_278._0_8_ = pSVar62;
                              uVar37 = 0;
                              if (uVar78 != 0) {
                                for (; (uVar78 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                                }
                              }
                              pSVar95 = (SourceLibrary *)
                                        (ppVar7 + (long)ppVar85 * 0xf + (ulong)uVar37);
                              pcVar19 = (pSVar95->name)._M_dataplus._M_p;
                              bVar54 = __n == pcVar19;
                              if ((__n != (pointer)0x0) && (__n == pcVar19)) {
                                iVar55 = bcmp((void *)local_208._0_8_,
                                              (void *)(pSVar95->name)._M_string_length,(size_t)__n);
                                bVar54 = iVar55 == 0;
                                auVar122 = local_228;
                              }
                              if (bVar54) goto LAB_002e473f;
                              uVar78 = uVar78 - 1 & uVar78;
                              ppVar68 = local_1d0;
                            } while (uVar78 != 0);
                          }
                          if (((byte)(local_210 + uVar50)[0xf] &
                              (&boost::unordered::detail::foa::
                                group15<boost::unordered::detail::foa::plain_integral>::
                                is_not_overflowed(unsigned_long)::shift)[(uint)uVar61 & 7]) == 0)
                          break;
                          pbVar48 = &in_R8->first;
                          in_R8 = (value_type_pointer)((long)&(in_R8->first)._M_len + 1);
                          ppVar85 = (value_type_pointer)
                                    ((ulong)((undefined1 *)((long)&(local_1f8->first)._M_len + 1) +
                                            (long)&pbVar48->_M_len) & (ulong)ppVar68);
                        } while (in_R8 <= ppVar68);
                        pSVar95 = (SourceLibrary *)0x0;
LAB_002e473f:
                        pSVar62 = pSVar95;
                        if (pSVar95 == (SourceLibrary *)0x0) break;
                      }
                      pPVar88 = pPVar88 + 1;
                      bVar53 = pPVar88 == pPVar59;
                    } while (!bVar53);
                  }
                  if (bVar53) {
                    auStack_a8 = (undefined1  [16])0x0;
                    iVar55 = 0xf;
                    local_b0 = pSVar72;
                    getRoot::anon_class_24_3_d9e6786c::operator()
                              ((anon_class_24_3_d9e6786c *)local_1f0,
                               (DefinitionLookupResult)ZEXT824(pSVar72),(SourceRange)ZEXT816(0));
                    goto LAB_002e47e8;
                  }
                }
                pDVar64 = Scope::addDiag(pSVar72->parentScope,(DiagCode)0x10000d,
                                         (SourceLocation)0xffffffffffffffff);
                iVar55 = 0xf;
                Diagnostic::operator<<(pDVar64,arg);
              }
LAB_002e47e8:
              if (pSVar72 == (Symbol *)0x0) goto LAB_002e47ed;
            }
            unaff_R13 = __u;
            sVar23 = local_238._M_len;
            if (iVar55 != 0) goto LAB_002e4b77;
          }
          else {
            sVar23 = local_238._M_len - 7;
            if (local_238._M_len < local_238._M_len - 7) {
              sVar23 = local_238._M_len;
            }
          }
          local_238._M_len = sVar23;
          uVar61 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                             (local_178,&local_238);
          pcVar14 = local_238._M_str;
          sVar23 = local_238._M_len;
          uVar94 = uVar61 >> ((byte)(this->configBlocks).table_.
                                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                                    .arrays.groups_size_index & 0x3f);
          pgVar89 = (this->configBlocks).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                    .arrays.groups_;
          uVar11 = (&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     match_word(unsigned_long)::word)[uVar61 & 0xff];
          ppVar20 = (this->configBlocks).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                    .arrays.elements_;
          local_278._0_8_ = local_238._M_str;
          ppVar68 = (value_type_pointer)
                    (this->configBlocks).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::vector<const_slang::ast::ConfigBlockSymbol_*>_>_>_>
                    .arrays.groups_size_mask;
          local_2a8 = (value_type_pointer)0x0;
          local_228._0_8_ = pgVar89;
          do {
            pgVar89 = pgVar89 + uVar94;
            uVar107 = (uchar)uVar11;
            auVar110[0] = -(pgVar89->m[0].n == uVar107);
            uVar118 = (uchar)((uint)uVar11 >> 8);
            auVar110[1] = -(pgVar89->m[1].n == uVar118);
            uVar119 = (uchar)((uint)uVar11 >> 0x10);
            auVar110[2] = -(pgVar89->m[2].n == uVar119);
            uVar120 = (uchar)((uint)uVar11 >> 0x18);
            auVar110[3] = -(pgVar89->m[3].n == uVar120);
            auVar110[4] = -(pgVar89->m[4].n == uVar107);
            auVar110[5] = -(pgVar89->m[5].n == uVar118);
            auVar110[6] = -(pgVar89->m[6].n == uVar119);
            auVar110[7] = -(pgVar89->m[7].n == uVar120);
            auVar110[8] = -(pgVar89->m[8].n == uVar107);
            auVar110[9] = -(pgVar89->m[9].n == uVar118);
            auVar110[10] = -(pgVar89->m[10].n == uVar119);
            auVar110[0xb] = -(pgVar89->m[0xb].n == uVar120);
            auVar110[0xc] = -(pgVar89->m[0xc].n == uVar107);
            auVar110[0xd] = -(pgVar89->m[0xd].n == uVar118);
            auVar110[0xe] = -(pgVar89->m[0xe].n == uVar119);
            auVar110[0xf] = -(pgVar89->m[0xf].n == uVar120);
            local_208._0_8_ = uVar94;
            for (uVar78 = (uint)(ushort)((ushort)(SUB161(auVar110 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar110 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar110 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar110 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar110 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar110 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar110 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar110 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar110 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar110 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar110 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar110 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar110 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar110 >> 0x6f,0) & 1) << 0xd |
                                        (ushort)(SUB161(auVar110 >> 0x77,0) & 1) << 0xe);
                uVar78 != 0; uVar78 = uVar78 - 1 & uVar78) {
              uVar37 = 0;
              if (uVar78 != 0) {
                for (; (uVar78 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                }
              }
              local_298 = ppVar20 + uVar94 * 0xf + (ulong)uVar37;
              bVar53 = sVar23 == (local_298->first)._M_len;
              if (bVar53 && sVar23 != 0) {
                iVar55 = bcmp(pcVar14,(local_298->first)._M_str,sVar23);
                bVar53 = iVar55 == 0;
              }
              if (bVar53) goto LAB_002e4a47;
            }
            if ((((group_type_pointer)(local_228._0_8_ + uVar94 * 0x10))->m[0xf].n &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(uint)uVar61 & 7]) == 0) break;
            in_R8 = (value_type_pointer)((long)&(local_2a8->first)._M_len + 1);
            uVar94 = (ulong)((long)&(local_2a8->first)._M_len + local_208._0_8_ + 1) &
                     (ulong)ppVar68;
            pgVar89 = (group_type_pointer)local_228._0_8_;
            local_2a8 = in_R8;
          } while (in_R8 <= ppVar68);
          local_298 = (value_type_pointer)0x0;
LAB_002e4a47:
          if (local_298 == (value_type_pointer)0x0) {
LAB_002e4b63:
            iVar55 = 0;
          }
          else {
            ppCVar21 = (local_298->second).
                       super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppCVar22 = (local_298->second).
                       super__Vector_base<const_slang::ast::ConfigBlockSymbol_*,_std::allocator<const_slang::ast::ConfigBlockSymbol_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            if (ppCVar21 == ppCVar22) {
              this_00 = (ConfigBlockSymbol *)0x0;
            }
            else {
              pCVar96 = (ConfigBlockSymbol *)0x0;
              do {
                ppCVar102 = ppCVar21 + 1;
                this_00 = *ppCVar21;
                pSVar62 = Symbol::getSourceLibrary(&this_00->super_Symbol);
                bVar53 = true;
                if ((pSVar62 != pSVar60) &&
                   ((pSVar60 != (SourceLibrary *)0x0 || (pSVar62->isDefault == false)))) {
                  bVar53 = false;
                  this_00 = pCVar96;
                }
              } while ((!bVar53) && (pCVar96 = this_00, ppCVar21 = ppCVar102, ppCVar102 != ppCVar22)
                      );
            }
            if (this_00 == (ConfigBlockSymbol *)0x0) {
              iVar55 = 0;
            }
            else {
              this_00->isUsed = true;
              if (this_00->resolved == false) {
                ConfigBlockSymbol::resolve(this_00);
              }
              sVar23 = (this_00->topCells)._M_extent._M_extent_value;
              iVar55 = 0xf;
              if (sVar23 != 0) {
                pTVar103 = (this_00->topCells)._M_ptr;
                pTVar97 = pTVar103 + sVar23;
                do {
                  local_170 = pTVar103->definition;
                  local_160 = pTVar103->rule;
                  result.configRoot = this_00;
                  result.definition = &local_170->super_Symbol;
                  result.configRule = local_160;
                  pCStack_168 = this_00;
                  getRoot::anon_class_24_3_d9e6786c::operator()
                            ((anon_class_24_3_d9e6786c *)local_1f0,result,pTVar103->sourceRange);
                  pTVar103 = pTVar103 + 1;
                  iVar55 = 0xf;
                } while (pTVar103 != pTVar97);
              }
            }
            if (this_00 == (ConfigBlockSymbol *)0x0) goto LAB_002e4b63;
          }
          if (iVar55 == 0) {
            pDVar64 = Scope::addDiag(&((this->root)._M_t.
                                       super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                       .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                      _M_head_impl)->super_Scope,(DiagCode)0x10000d,
                                     (SourceLocation)0xffffffffffffffff);
            Diagnostic::operator<<(pDVar64,arg_00);
          }
        }
LAB_002e4b77:
        paVar56 = (anon_class_1_0_00000001 *)(iVar128.pc_ + 2);
        do {
          paVar63 = paVar56;
          puVar81 = iVar128.pc_;
          pbVar104 = iVar128.p_ + 1;
          if (((uint)iVar128.pc_ & 0xf) == 0xe) goto LAB_002e4bfb;
          paVar1 = paVar63 + -1;
          iVar128.p_ = pbVar104;
          iVar128.pc_ = puVar81 + 1;
          paVar56 = paVar63 + 1;
        } while (*paVar1 == (anon_class_1_0_00000001)0x0);
        paVar63 = paVar63 + -1;
        if (*paVar1 == (anon_class_1_0_00000001)0x1) {
          pbVar104 = (table_element_pointer)0x0;
        }
        goto LAB_002e4ba7;
      }
LAB_002e4c52:
      iVar129 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>,_std::equal_to<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>,_bool>_>_>_>
                ::begin(&(this->definitionMap).table_);
      ppVar73 = iVar129.p_;
      if (ppVar73 != (table_element_pointer)0x0) {
        ppVar76 = ppVar73;
LAB_002e4c8b:
        puVar98 = iVar129.pc_;
        pRVar100 = (this->root)._M_t.
                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        pSVar69 = &pRVar100->super_Scope;
        if (pRVar100 == (RootSymbol *)0x0) {
          pSVar69 = (Scope *)0x0;
        }
        if ((ppVar76->first).
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
            .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
            super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl == pSVar69) {
          ppSVar58 = (ppVar76->second).first.
                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppSVar17 = (ppVar76->second).first.
                     super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          if (ppSVar58 != ppSVar17) {
            local_208._0_8_ = ppVar76;
            do {
              puVar65 = iVar129.pc_;
              _Var24._M_head_impl = (Scope *)*ppSVar58;
              if (*(int *)&(_Var24._M_head_impl)->compilation == 2) {
                uVar61 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                         operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                     *)&this->globalInstantiations,
                                    (string_view *)&(_Var24._M_head_impl)->thisSym);
                ppVar73 = (table_element_pointer)
                          (uVar61 >>
                          ((byte)(this->globalInstantiations).table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                                 .arrays.groups_size_index & 0x3f));
                pgVar25 = (this->globalInstantiations).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_;
                uVar11 = (&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           match_word(unsigned_long)::word)[uVar61 & 0xff];
                local_228._0_8_ =
                     (this->globalInstantiations).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                     .arrays.elements_;
                ppVar68 = (value_type_pointer)
                          (this->globalInstantiations).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                          .arrays.groups_size_mask;
                in_R8 = (value_type_pointer)0x0;
                do {
                  pgVar6 = pgVar25 + (long)ppVar73;
                  uVar107 = (uchar)uVar11;
                  auVar112[0] = -(pgVar6->m[0].n == uVar107);
                  uVar118 = (uchar)((uint)uVar11 >> 8);
                  auVar112[1] = -(pgVar6->m[1].n == uVar118);
                  uVar119 = (uchar)((uint)uVar11 >> 0x10);
                  auVar112[2] = -(pgVar6->m[2].n == uVar119);
                  uVar120 = (uchar)((uint)uVar11 >> 0x18);
                  auVar112[3] = -(pgVar6->m[3].n == uVar120);
                  auVar112[4] = -(pgVar6->m[4].n == uVar107);
                  auVar112[5] = -(pgVar6->m[5].n == uVar118);
                  auVar112[6] = -(pgVar6->m[6].n == uVar119);
                  auVar112[7] = -(pgVar6->m[7].n == uVar120);
                  auVar112[8] = -(pgVar6->m[8].n == uVar107);
                  auVar112[9] = -(pgVar6->m[9].n == uVar118);
                  auVar112[10] = -(pgVar6->m[10].n == uVar119);
                  auVar112[0xb] = -(pgVar6->m[0xb].n == uVar120);
                  auVar112[0xc] = -(pgVar6->m[0xc].n == uVar107);
                  auVar112[0xd] = -(pgVar6->m[0xd].n == uVar118);
                  auVar112[0xe] = -(pgVar6->m[0xe].n == uVar119);
                  auVar112[0xf] = -(pgVar6->m[0xf].n == uVar120);
                  uVar78 = (uint)(ushort)((ushort)(SUB161(auVar112 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar112 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar112 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar112 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar112 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar112 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar112 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar112 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar112 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar112 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar112 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar112 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar112 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar112 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar112 >> 0x77,0) & 1) << 0xe);
                  if (uVar78 != 0) {
                    lVar71 = local_228._0_8_ + (long)ppVar73 * 0xf0;
                    pSVar72 = (Symbol *)((string_view *)&(_Var24._M_head_impl)->thisSym)->_M_len;
                    pSVar28 = (_Var24._M_head_impl)->nameMap;
                    ppVar74 = ppVar73;
                    do {
                      iVar55 = 0;
                      if (uVar78 != 0) {
                        for (; (uVar78 >> iVar55 & 1) == 0; iVar55 = iVar55 + 1) {
                        }
                      }
                      bVar53 = pSVar72 == *(Symbol **)(lVar71 + (ulong)(uint)(iVar55 << 4));
                      lVar82 = lVar71 + (ulong)(uint)(iVar55 << 4);
                      if (bVar53 && pSVar72 != (Symbol *)0x0) {
                        iVar55 = bcmp(pSVar28,*(void **)(lVar82 + 8),(size_t)pSVar72);
                        bVar53 = iVar55 == 0;
                        ppVar74 = extraout_RDX;
                      }
                      ppVar76 = (table_element_pointer)local_208._0_8_;
                      puVar65 = puVar98;
                      if (bVar53) {
                        local_278._0_8_ = lVar82;
                        goto LAB_002e4ecb;
                      }
                      uVar78 = uVar78 - 1 & uVar78;
                    } while (uVar78 != 0);
                  }
                  ppVar74 = (table_element_pointer)(pgVar25 + (long)ppVar73);
                  if ((*(byte *)((long)&(ppVar74->first).
                                        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                        .
                                        super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                        ._M_head_impl._M_len + 7) &
                      (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        is_not_overflowed(unsigned_long)::shift)[(uint)uVar61 & 7]) == 0) break;
                  pbVar48 = &in_R8->first;
                  in_R8 = (value_type_pointer)((long)&(in_R8->first)._M_len + 1);
                  ppVar73 = (table_element_pointer)
                            ((ulong)((undefined1 *)
                                     ((long)&(ppVar73->first).
                                             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                             .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                                             super__Head_base<1UL,_const_slang::ast::Scope_*,_false>
                                             ._M_head_impl + 1) + (long)&pbVar48->_M_len) &
                            (ulong)ppVar68);
                  ppVar74 = ppVar73;
                } while (in_R8 <= ppVar68);
                auVar42._8_8_ = 0;
                auVar42._0_8_ = local_278._8_8_;
                local_278 = auVar42 << 0x40;
LAB_002e4ecb:
                iVar129.p_ = ppVar74;
                iVar129.pc_ = puVar65;
                if ((local_278._0_8_ == 0) &&
                   (*(char *)((long)&((_Var24._M_head_impl[0xc].importData)->importedSymbols).table_
                                     .
                                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::Symbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::Symbol_*>_>_>
                                     .size_ctrl.ml + 4) == '\x01')) {
                  if (_Var24._M_head_impl[0xd].thisSym != (Symbol *)0x0) goto LAB_002e4d0b;
                  local_190.
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
                       (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)_Var24._M_head_impl;
                  std::
                  vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                  ::emplace_back<slang::ast::DefinitionSymbol_const*>
                            ((vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>
                              *)&this->unreferencedDefs,(DefinitionSymbol **)&local_190);
                  ppVar74 = extraout_RDX_00;
                }
                iVar129.p_ = ppVar74;
              }
LAB_002e4d0b:
              ppSVar58 = ppSVar58 + 1;
            } while (ppSVar58 != ppSVar17);
          }
        }
        ppVar73 = iVar129.p_;
        puVar65 = iVar129.pc_;
        puVar98 = puVar65 + 2;
        do {
          puVar99 = puVar98;
          ppVar76 = ppVar76 + 1;
          if (((uint)puVar65 & 0xf) == 0xe) goto LAB_002e4f21;
          bVar10 = puVar99[-1];
          paVar63 = (anon_class_1_0_00000001 *)(ulong)bVar10;
          puVar65 = puVar65 + 1;
          puVar98 = puVar99 + 1;
        } while (bVar10 == 0);
        puVar99 = puVar99 + -1;
        if (bVar10 == 1) {
          ppVar76 = (table_element_pointer)0x0;
        }
        goto LAB_002e4cd8;
      }
LAB_002e4f7a:
      local_1f0._0_8_ = local_f0;
      if ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)
          paStack_d0 !=
          (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)0x0) {
        paVar63 = (anon_class_1_0_00000001 *)0xaaaaaaaaaaaaaaab;
        slang::detail::hashing::
        StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
        ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_96UL,_16UL>
                      *)local_1f0,
                     (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>
                      *)paStack_d0,((long)local_e0 * 0x178 + 0x186U) / 0x18);
        ppVar73 = extraout_RDX_01;
      }
    }
LAB_002e55ad:
    sVar26 = local_98.
             super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
             .len;
    ppVar66 = local_98.
              super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
              .data_;
    if (local_98.
        super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
        .len != 0) {
      lVar82 = local_98.
               super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
               .len * 0x28;
      ppVar105 = local_98.
                 super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                 .data_ + local_98.
                          super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                          .len;
      lVar71 = 0x3f;
      if (local_98.
          super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
          .len != 0) {
        for (; local_98.
               super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
               .len >> lVar71 == 0; lVar71 = lVar71 + -1) {
        }
      }
      __comp._M_comp.__proj = (identity *)in_R8;
      __comp._M_comp.__comp = paVar63;
      std::
      __introsort_loop<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,long,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (local_98.
                 super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                 .data_,ppVar105,(ulong)(((uint)lVar71 ^ 0x3f) * 2) ^ 0x7e,__comp);
      if ((long)sVar26 < 0x11) {
        __comp_04._M_comp.__proj = (identity *)paVar63;
        __comp_04._M_comp.__comp = extraout_RDX_05;
        std::
        __insertion_sort<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (ppVar66,ppVar105,__comp_04);
        ppVar73 = extraout_RDX_08;
      }
      else {
        ppVar105 = ppVar66 + 0x10;
        __comp_03._M_comp.__proj = (identity *)paVar63;
        __comp_03._M_comp.__comp = extraout_RDX_05;
        ppVar86 = ppVar105;
        std::
        __insertion_sort<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (ppVar66,ppVar105,__comp_03);
        lVar82 = lVar82 + -0x280;
        ppVar73 = extraout_RDX_06;
        do {
          __comp_01._M_comp.__proj = (identity *)ppVar73;
          __comp_01._M_comp.__comp = (anon_class_1_0_00000001 *)ppVar86;
          std::
          __unguarded_linear_insert<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::SourceRange>*,__gnu_cxx::__ops::_Val_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__1,std::identity>(slang::ast::Compilation::getRoot(bool)::__1&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                    (ppVar105,__comp_01);
          ppVar105 = ppVar105 + 1;
          lVar82 = lVar82 + -0x28;
          ppVar73 = extraout_RDX_07;
        } while (lVar82 != 0);
      }
    }
    __first._M_current =
         (this->unreferencedDefs).
         super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         (this->unreferencedDefs).
         super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__first._M_current != __last._M_current) {
      uVar94 = (long)__last._M_current - (long)__first._M_current >> 3;
      lVar71 = 0x3f;
      if (uVar94 != 0) {
        for (; uVar94 >> lVar71 == 0; lVar71 = lVar71 + -1) {
        }
      }
      __comp_00._M_comp.__proj = (identity *)in_R8;
      __comp_00._M_comp.__comp = paVar63;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                (__first,__last,(ulong)(((uint)lVar71 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
      if ((long)__last._M_current - (long)__first._M_current < 0x81) {
        __comp_06._M_comp.__proj = (identity *)paVar63;
        __comp_06._M_comp.__comp = extraout_RDX_09;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (__first,__last,__comp_06);
        ppVar73 = extraout_RDX_12;
      }
      else {
        __last_00._M_current = __first._M_current + 0x10;
        __comp_05._M_comp.__proj = (identity *)paVar63;
        __comp_05._M_comp.__comp = extraout_RDX_09;
        _Var87._M_current = __last_00._M_current;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                  (__first,__last_00,__comp_05);
        ppVar73 = extraout_RDX_10;
        for (; __last_00._M_current != __last._M_current;
            __last_00._M_current = __last_00._M_current + 1) {
          __comp_02._M_comp.__proj = (identity *)ppVar73;
          __comp_02._M_comp.__comp = (anon_class_1_0_00000001 *)_Var87._M_current;
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<slang::ast::DefinitionSymbol_const**,std::vector<slang::ast::DefinitionSymbol_const*,std::allocator<slang::ast::DefinitionSymbol_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<std::ranges::__detail::__make_comp_proj<slang::ast::Compilation::getRoot(bool)::__2,std::identity>(slang::ast::Compilation::getRoot(bool)::__2&,std::identity&)::_lambda(auto:1&&,auto:2&&)_1_>>
                    (__last_00,__comp_02);
          ppVar73 = extraout_RDX_11;
        }
      }
    }
    if ((local_198 != 0) &&
       (local_98.
        super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
        .len != 0)) {
      ppVar105 = local_98.
                 super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                 .data_ + local_98.
                          super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                          .len;
      local_210 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                   *)&(this->hierarchyOverrides).childNodes;
      ppVar66 = local_98.
                super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                .data_;
      do {
        pSVar72 = (ppVar66->first).definition;
        if (pSVar72[1].nextInScope != (Symbol *)0x0) {
          local_228._0_8_ = pSVar72;
          pSVar69 = pSVar72[1].parentScope;
          puVar83 = (undefined1 *)((long)pSVar72[1].nextInScope * 0x40 + (long)pSVar69);
          do {
            if ((*(char *)&pSVar69[1].compilation == '\0') &&
               (*(char *)((long)&pSVar69[1].compilation + 3) == '\x01')) {
              uVar61 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)local_1c0,
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  &pSVar69->nameMap);
              uVar50 = local_1c0._8_8_;
              uVar94 = uVar61 >> ((byte)local_1c0[0] & 0x3f);
              uVar51 = local_1c0._16_8_;
              uVar11 = (&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         match_word(unsigned_long)::word)[uVar61 & 0xff];
              ppVar68 = ppStack_1a8;
              ppVar76 = (table_element_pointer)(ulong)((uint)uVar61 & 7);
              ppVar85 = (value_type_pointer)0x0;
              do {
                pgVar5 = (group_type_pointer)(uVar51 + uVar94 * 0x10);
                uVar107 = (uchar)uVar11;
                auVar117[0] = -(pgVar5->m[0].n == uVar107);
                uVar118 = (uchar)((uint)uVar11 >> 8);
                auVar117[1] = -(pgVar5->m[1].n == uVar118);
                uVar119 = (uchar)((uint)uVar11 >> 0x10);
                auVar117[2] = -(pgVar5->m[2].n == uVar119);
                uVar120 = (uchar)((uint)uVar11 >> 0x18);
                auVar117[3] = -(pgVar5->m[3].n == uVar120);
                auVar117[4] = -(pgVar5->m[4].n == uVar107);
                auVar117[5] = -(pgVar5->m[5].n == uVar118);
                auVar117[6] = -(pgVar5->m[6].n == uVar119);
                auVar117[7] = -(pgVar5->m[7].n == uVar120);
                auVar117[8] = -(pgVar5->m[8].n == uVar107);
                auVar117[9] = -(pgVar5->m[9].n == uVar118);
                auVar117[10] = -(pgVar5->m[10].n == uVar119);
                auVar117[0xb] = -(pgVar5->m[0xb].n == uVar120);
                auVar117[0xc] = -(pgVar5->m[0xc].n == uVar107);
                auVar117[0xd] = -(pgVar5->m[0xd].n == uVar118);
                auVar117[0xe] = -(pgVar5->m[0xe].n == uVar119);
                auVar117[0xf] = -(pgVar5->m[0xf].n == uVar120);
                uVar78 = (uint)(ushort)((ushort)(SUB161(auVar117 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar117 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar117 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar117 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar117 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar117 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar117 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar117 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar117 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar117 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar117 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar117 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar117 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar117 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar117 >> 0x77,0) & 1) << 0xe);
                uVar80 = uVar94;
                if (uVar78 != 0) {
                  local_208._0_8_ = uVar94;
                  pSVar28 = pSVar69->nameMap;
                  pSVar72 = pSVar69->firstMember;
                  ppVar73 = ppVar76;
                  do {
                    uVar37 = 0;
                    if (uVar78 != 0) {
                      for (; (uVar78 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                      }
                    }
                    ppVar7 = ppVar68 + uVar94 * 0xf + (ulong)uVar37;
                    bVar53 = pSVar28 == (SymbolMap *)(ppVar7->first)._M_len;
                    ppVar73 = (table_element_pointer)
                              CONCAT71((int7)((ulong)ppVar73 >> 8),
                                       !bVar53 || pSVar28 == (SymbolMap *)0x0);
                    if (bVar53 && pSVar28 != (SymbolMap *)0x0) {
                      iVar55 = bcmp(pSVar72,(ppVar7->first)._M_str,(size_t)pSVar28);
                      bVar53 = iVar55 == 0;
                      ppVar73 = extraout_RDX_13;
                    }
                    if (bVar53) {
                      local_278._0_8_ = ppVar7;
                      goto LAB_002e58e4;
                    }
                    uVar78 = uVar78 - 1 & uVar78;
                  } while (uVar78 != 0);
                  uVar80 = local_208._0_8_;
                }
                if ((((group_type_pointer)(uVar51 + uVar94 * 0x10))->m[0xf].n &
                    *(byte *)&ppVar76[0x15106].second.first.
                              super__Vector_base<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish) == 0) {
                  auVar47._8_8_ = 0;
                  auVar47._0_8_ = local_278._8_8_;
                  local_278 = auVar47 << 0x40;
                  ppVar73 = ppVar76;
                  goto LAB_002e58e4;
                }
                pbVar48 = &ppVar85->first;
                ppVar85 = (value_type_pointer)((long)&(ppVar85->first)._M_len + 1);
                uVar94 = (ulong)((long)&pbVar48->_M_len + uVar80 + 1) & uVar50;
              } while (ppVar85 <= (ulong)uVar50);
              auVar46._8_8_ = 0;
              auVar46._0_8_ = local_278._8_8_;
              local_278 = auVar46 << 0x40;
              ppVar73 = ppVar76;
LAB_002e58e4:
              if (local_278._0_8_ != 0) {
                local_238._M_len = *(ulong *)(local_228._0_8_ + 0x38);
                auVar38._8_8_ = 0;
                auVar38._0_8_ = local_238._M_len;
                uVar93 = SUB168(auVar38 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                         SUB168(auVar38 * ZEXT816(0x9e3779b97f4a7c15),0);
                uVar91 = uVar93 >> ((byte)(this->hierarchyOverrides).childNodes.table_.
                                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                          .arrays.groups_size_index & 0x3f);
                pgVar32 = (this->hierarchyOverrides).childNodes.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                          .arrays.groups_;
                uVar11 = (&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           match_word(unsigned_long)::word)[uVar93 & 0xff];
                ppVar33 = (this->hierarchyOverrides).childNodes.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                          .arrays.elements_;
                uVar94 = (this->hierarchyOverrides).childNodes.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                         .arrays.groups_size_mask;
                uVar90 = 0;
                uVar80 = uVar91;
                do {
                  pgVar8 = pgVar32 + uVar80;
                  uVar107 = (uchar)uVar11;
                  auVar125[0] = -(pgVar8->m[0].n == uVar107);
                  uVar118 = (uchar)((uint)uVar11 >> 8);
                  auVar125[1] = -(pgVar8->m[1].n == uVar118);
                  uVar119 = (uchar)((uint)uVar11 >> 0x10);
                  auVar125[2] = -(pgVar8->m[2].n == uVar119);
                  uVar120 = (uchar)((uint)uVar11 >> 0x18);
                  auVar125[3] = -(pgVar8->m[3].n == uVar120);
                  auVar125[4] = -(pgVar8->m[4].n == uVar107);
                  auVar125[5] = -(pgVar8->m[5].n == uVar118);
                  auVar125[6] = -(pgVar8->m[6].n == uVar119);
                  auVar125[7] = -(pgVar8->m[7].n == uVar120);
                  auVar125[8] = -(pgVar8->m[8].n == uVar107);
                  auVar125[9] = -(pgVar8->m[9].n == uVar118);
                  auVar125[10] = -(pgVar8->m[10].n == uVar119);
                  auVar125[0xb] = -(pgVar8->m[0xb].n == uVar120);
                  auVar125[0xc] = -(pgVar8->m[0xc].n == uVar107);
                  auVar125[0xd] = -(pgVar8->m[0xd].n == uVar118);
                  auVar125[0xe] = -(pgVar8->m[0xe].n == uVar119);
                  auVar125[0xf] = -(pgVar8->m[0xf].n == uVar120);
                  for (uVar78 = (uint)(ushort)((ushort)(SUB161(auVar125 >> 7,0) & 1) |
                                               (ushort)(SUB161(auVar125 >> 0xf,0) & 1) << 1 |
                                               (ushort)(SUB161(auVar125 >> 0x17,0) & 1) << 2 |
                                               (ushort)(SUB161(auVar125 >> 0x1f,0) & 1) << 3 |
                                               (ushort)(SUB161(auVar125 >> 0x27,0) & 1) << 4 |
                                               (ushort)(SUB161(auVar125 >> 0x2f,0) & 1) << 5 |
                                               (ushort)(SUB161(auVar125 >> 0x37,0) & 1) << 6 |
                                               (ushort)(SUB161(auVar125 >> 0x3f,0) & 1) << 7 |
                                               (ushort)(SUB161(auVar125 >> 0x47,0) & 1) << 8 |
                                               (ushort)(SUB161(auVar125 >> 0x4f,0) & 1) << 9 |
                                               (ushort)(SUB161(auVar125 >> 0x57,0) & 1) << 10 |
                                               (ushort)(SUB161(auVar125 >> 0x5f,0) & 1) << 0xb |
                                               (ushort)(SUB161(auVar125 >> 0x67,0) & 1) << 0xc |
                                               (ushort)(SUB161(auVar125 >> 0x6f,0) & 1) << 0xd |
                                              (ushort)(SUB161(auVar125 >> 0x77,0) & 1) << 0xe);
                      uVar78 != 0; uVar78 = uVar78 - 1 & uVar78) {
                    iVar55 = 0;
                    if (uVar78 != 0) {
                      for (; (uVar78 >> iVar55 & 1) == 0; iVar55 = iVar55 + 1) {
                      }
                    }
                    if (*(ulong *)((long)&ppVar33[uVar80 * 0xf].first.value +
                                  (ulong)(uint)(iVar55 << 7)) == local_238._M_len) {
                      ppVar92 = (pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                                 *)((long)&ppVar33[uVar80 * 0xf].first.value +
                                   (ulong)(uint)(iVar55 << 7));
                      goto LAB_002e5a18;
                    }
                  }
                  if ((pgVar32[uVar80].m[0xf].n &
                      (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        is_not_overflowed(unsigned_long)::shift)[(uint)uVar93 & 7]) == 0) {
                    ppVar92 = (pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                               *)0x0;
                    goto LAB_002e5a18;
                  }
                  lVar71 = uVar80 + uVar90;
                  uVar90 = uVar90 + 1;
                  uVar80 = lVar71 + 1U & uVar94;
                } while (uVar90 <= uVar94);
                ppVar92 = (pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                           *)0x0;
LAB_002e5a18:
                if (ppVar92 ==
                    (pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                     *)0x0) {
                  if ((this->hierarchyOverrides).childNodes.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                      .size_ctrl.size <
                      (this->hierarchyOverrides).childNodes.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                      .size_ctrl.ml) {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                    ::
                    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
                              ((locator *)local_158,local_210,(arrays_type *)local_210,uVar91,uVar93
                               ,(try_emplace_args_t *)local_1f0,(Entry *)&local_238);
                    psVar3 = &(this->hierarchyOverrides).childNodes.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                              .size_ctrl.size;
                    *psVar3 = *psVar3 + 1;
                  }
                  else {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,slang::ast::HierarchyOverrideNode>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::OpaqueInstancePath::Entry,void>,std::equal_to<slang::ast::OpaqueInstancePath::Entry>,std::allocator<std::pair<slang::ast::OpaqueInstancePath::Entry_const,slang::ast::HierarchyOverrideNode>>>
                    ::
                    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::OpaqueInstancePath::Entry>
                              ((locator *)local_158,local_210,uVar93,(try_emplace_args_t *)local_1f0
                               ,(Entry *)&local_238);
                  }
                  ppVar92 = (pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>
                             *)local_158._16_8_;
                }
                std::__detail::__variant::
                _Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::_Copy_ctor_base((_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                   *)local_158,
                                  *(_Copy_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                    **)(local_278._0_8_ + 0x10));
                pHVar77 = &ppVar92->second;
                local_130 = (Symbol *)0x0;
                local_190.
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                     (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)pSVar69->thisSym;
                auVar39._8_8_ = 0;
                auVar39._0_8_ =
                     local_190.
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                     .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                     super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl;
                uVar93 = SUB168(auVar39 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                         SUB168(auVar39 * ZEXT816(0x9e3779b97f4a7c15),0);
                uVar80 = uVar93 >> ((byte)(ppVar92->second).paramOverrides.table_.
                                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                                          .arrays.groups_size_index & 0x3f);
                pgVar29 = (ppVar92->second).paramOverrides.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                          .arrays.groups_;
                uVar11 = (&boost::unordered::detail::foa::
                           group15<boost::unordered::detail::foa::plain_integral>::
                           match_word(unsigned_long)::word)[uVar93 & 0xff];
                uVar91 = 0;
                uVar94 = uVar80;
                do {
                  pgVar9 = pgVar29 + uVar94;
                  uVar107 = (uchar)uVar11;
                  auVar126[0] = -(pgVar9->m[0].n == uVar107);
                  uVar118 = (uchar)((uint)uVar11 >> 8);
                  auVar126[1] = -(pgVar9->m[1].n == uVar118);
                  uVar119 = (uchar)((uint)uVar11 >> 0x10);
                  auVar126[2] = -(pgVar9->m[2].n == uVar119);
                  uVar120 = (uchar)((uint)uVar11 >> 0x18);
                  auVar126[3] = -(pgVar9->m[3].n == uVar120);
                  auVar126[4] = -(pgVar9->m[4].n == uVar107);
                  auVar126[5] = -(pgVar9->m[5].n == uVar118);
                  auVar126[6] = -(pgVar9->m[6].n == uVar119);
                  auVar126[7] = -(pgVar9->m[7].n == uVar120);
                  auVar126[8] = -(pgVar9->m[8].n == uVar107);
                  auVar126[9] = -(pgVar9->m[9].n == uVar118);
                  auVar126[10] = -(pgVar9->m[10].n == uVar119);
                  auVar126[0xb] = -(pgVar9->m[0xb].n == uVar120);
                  auVar126[0xc] = -(pgVar9->m[0xc].n == uVar107);
                  auVar126[0xd] = -(pgVar9->m[0xd].n == uVar118);
                  auVar126[0xe] = -(pgVar9->m[0xe].n == uVar119);
                  auVar126[0xf] = -(pgVar9->m[0xf].n == uVar120);
                  uVar78 = (uint)(ushort)((ushort)(SUB161(auVar126 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar126 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar126 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar126 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar126 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar126 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar126 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar126 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar126 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar126 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar126 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar126 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar126 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar126 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar126 >> 0x77,0) & 1) << 0xe);
                  if (uVar78 != 0) {
                    ppVar106 = (ppVar92->second).paramOverrides.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                               .arrays.elements_;
                    do {
                      uVar37 = 0;
                      if (uVar78 != 0) {
                        for (; (uVar78 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
                        }
                      }
                      if (local_190.
                          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                          .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                          super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl ==
                          (Scope *)ppVar106[uVar94 * 0xf + (ulong)uVar37].first) {
                        ppVar106 = ppVar106 + uVar94 * 0xf + (ulong)uVar37;
                        goto LAB_002e5baf;
                      }
                      uVar78 = uVar78 - 1 & uVar78;
                    } while (uVar78 != 0);
                  }
                  if ((pgVar29[uVar94].m[0xf].n &
                      (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        is_not_overflowed(unsigned_long)::shift)[(uint)uVar93 & 7]) == 0) {
                    ppVar106 = (value_type_pointer)0x0;
                    goto LAB_002e5baf;
                  }
                  uVar90 = (ppVar92->second).paramOverrides.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                           .arrays.groups_size_mask;
                  lVar71 = uVar94 + uVar91;
                  uVar91 = uVar91 + 1;
                  uVar94 = lVar71 + 1U & uVar90;
                } while (uVar91 <= uVar90);
                ppVar106 = (value_type_pointer)0x0;
LAB_002e5baf:
                if (ppVar106 == (value_type_pointer)0x0) {
                  if ((ppVar92->second).paramOverrides.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                      .size_ctrl.size <
                      (ppVar92->second).paramOverrides.table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                      .size_ctrl.ml) {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                    ::
                    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,decltype(nullptr)>>
                              ((locator *)local_1f0,
                               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                                *)pHVar77,(arrays_type *)pHVar77,uVar80,uVar93,
                               (try_emplace_args_t *)&local_1d8,(SyntaxNode **)&local_190,
                               (pair<slang::ConstantValue,_std::nullptr_t> *)local_158);
                    psVar3 = &(ppVar92->second).paramOverrides.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_std::pair<slang::ConstantValue,_const_slang::syntax::SyntaxNode_*>_>_>_>
                              .size_ctrl.size;
                    *psVar3 = *psVar3 + 1;
                  }
                  else {
                    boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                    ::
                    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,decltype(nullptr)>>
                              ((locator *)local_1f0,
                               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::pair<slang::ConstantValue,slang::syntax::SyntaxNode_const*>>>>
                                *)pHVar77,uVar93,(try_emplace_args_t *)&local_1d8,
                               (SyntaxNode **)&local_190,
                               (pair<slang::ConstantValue,_std::nullptr_t> *)local_158);
                  }
                }
                std::__detail::__variant::
                _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                     *)local_158);
                ppVar73 = extraout_RDX_14;
              }
            }
            pSVar69 = (Scope *)&pSVar69[1].thisSym;
          } while (pSVar69 != (Scope *)puVar83);
        }
        ppVar66 = ppVar66 + 1;
      } while (ppVar66 != ppVar105);
    }
    local_158._0_8_ = &local_140;
    local_158._8_16_ = ZEXT816(5) << 0x40;
    if (local_98.
        super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
        .len != 0) {
      ppVar105 = local_98.
                 super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                 .data_ + local_98.
                          super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                          .len;
      ppVar66 = local_98.
                super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                .data_;
      do {
        pDVar30 = (DefinitionSymbol *)(ppVar66->first).definition;
        pSVar31 = (pDVar30->super_Symbol).originatingSyntax;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = pSVar31;
        uVar80 = SUB168(auVar40 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar40 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar93 = uVar80 >> ((byte)(this->hierarchyOverrides).childNodes.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                                  .arrays.groups_size_index & 0x3f);
        pgVar32 = (this->hierarchyOverrides).childNodes.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                  .arrays.groups_;
        uVar11 = (&boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word)[uVar80 & 0xff];
        ppVar33 = (this->hierarchyOverrides).childNodes.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                  .arrays.elements_;
        uVar94 = (this->hierarchyOverrides).childNodes.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>,_slang::hash<slang::ast::OpaqueInstancePath::Entry>,_std::equal_to<slang::ast::OpaqueInstancePath::Entry>,_std::allocator<std::pair<const_slang::ast::OpaqueInstancePath::Entry,_slang::ast::HierarchyOverrideNode>_>_>
                 .arrays.groups_size_mask;
        uVar91 = 0;
        do {
          pgVar8 = pgVar32 + uVar93;
          uVar107 = (uchar)uVar11;
          auVar127[0] = -(pgVar8->m[0].n == uVar107);
          uVar118 = (uchar)((uint)uVar11 >> 8);
          auVar127[1] = -(pgVar8->m[1].n == uVar118);
          uVar119 = (uchar)((uint)uVar11 >> 0x10);
          auVar127[2] = -(pgVar8->m[2].n == uVar119);
          uVar120 = (uchar)((uint)uVar11 >> 0x18);
          auVar127[3] = -(pgVar8->m[3].n == uVar120);
          auVar127[4] = -(pgVar8->m[4].n == uVar107);
          auVar127[5] = -(pgVar8->m[5].n == uVar118);
          auVar127[6] = -(pgVar8->m[6].n == uVar119);
          auVar127[7] = -(pgVar8->m[7].n == uVar120);
          auVar127[8] = -(pgVar8->m[8].n == uVar107);
          auVar127[9] = -(pgVar8->m[9].n == uVar118);
          auVar127[10] = -(pgVar8->m[10].n == uVar119);
          auVar127[0xb] = -(pgVar8->m[0xb].n == uVar120);
          auVar127[0xc] = -(pgVar8->m[0xc].n == uVar107);
          auVar127[0xd] = -(pgVar8->m[0xd].n == uVar118);
          auVar127[0xe] = -(pgVar8->m[0xe].n == uVar119);
          auVar127[0xf] = -(pgVar8->m[0xf].n == uVar120);
          for (uVar78 = (uint)(ushort)((ushort)(SUB161(auVar127 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar127 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar127 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar127 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar127 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar127 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar127 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar127 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar127 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar127 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar127 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar127 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar127 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar127 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar127 >> 0x77,0) & 1) << 0xe); uVar78 != 0;
              uVar78 = uVar78 - 1 & uVar78) {
            iVar55 = 0;
            if (uVar78 != 0) {
              for (; (uVar78 >> iVar55 & 1) == 0; iVar55 = iVar55 + 1) {
              }
            }
            if (*(SyntaxNode **)
                 ((long)&ppVar33[uVar93 * 0xf].first.value + (ulong)(uint)(iVar55 << 7)) == pSVar31)
            {
              lVar71 = (long)&ppVar33[uVar93 * 0xf].first.value + (ulong)(uint)(iVar55 << 7);
              goto LAB_002e5dd4;
            }
          }
          if ((pgVar32[uVar93].m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar80 & 7]) == 0) break;
          lVar71 = uVar93 + uVar91;
          uVar91 = uVar91 + 1;
          uVar93 = lVar71 + 1U & uVar94;
        } while (uVar91 <= uVar94);
        lVar71 = 0;
LAB_002e5dd4:
        pHVar77 = (HierarchyOverrideNode *)(lVar71 + 8);
        if (lVar71 == 0) {
          pHVar77 = (HierarchyOverrideNode *)0x0;
        }
        pIVar67 = InstanceSymbol::createDefault
                            (this,pDVar30,pHVar77,(ppVar66->first).configRoot,
                             (ppVar66->first).configRule,(SourceLocation)0x0);
        pRVar100 = (this->root)._M_t.
                   super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                   .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
        Scope::insertMember(&pRVar100->super_Scope,(Symbol *)pIVar67,
                            (pRVar100->super_Scope).lastMember,false,true);
        local_1f0._0_8_ = pIVar67;
        SmallVectorBase<slang::ast::InstanceSymbol_const*>::
        emplace_back<slang::ast::InstanceSymbol_const*>
                  ((SmallVectorBase<slang::ast::InstanceSymbol_const*> *)local_158,
                   (InstanceSymbol **)local_1f0);
        ppVar66 = ppVar66 + 1;
        ppVar73 = extraout_RDX_15;
      } while (ppVar66 != ppVar105);
    }
    if ((((this->options).flags.m_bits & 0x50) == 0) &&
       (local_98.
        super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
        .len == 0)) {
      Scope::addDiag(&((this->root)._M_t.
                       super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                       .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl)->
                      super_Scope,(DiagCode)0x2a000d,(SourceLocation)0xffffffffffffffff);
      ppVar73 = extraout_RDX_16;
    }
    ppDVar34 = (this->unreferencedDefs).
               super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (ppDVar84 = (this->unreferencedDefs).
                    super__Vector_base<const_slang::ast::DefinitionSymbol_*,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppDVar84 != ppDVar34;
        ppDVar84 = ppDVar84 + 1) {
      pRVar100 = (this->root)._M_t.
                 super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                 .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
      pIVar67 = InstanceSymbol::createInvalid(this,*ppDVar84);
      Scope::insertMember(&pRVar100->super_Scope,(Symbol *)pIVar67,
                          (pRVar100->super_Scope).lastMember,false,true);
      ppVar73 = extraout_RDX_17;
    }
    iVar55 = SmallVectorBase<const_slang::ast::InstanceSymbol_*>::copy
                       ((SmallVectorBase<const_slang::ast::InstanceSymbol_*> *)local_158,
                        (EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)ppVar73);
    pRVar100 = (this->root)._M_t.
               super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
               .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    (pRVar100->topInstances)._M_ptr = (pointer)CONCAT44(extraout_var,iVar55);
    (pRVar100->topInstances)._M_extent._M_extent_value = extraout_RDX_18;
    ppCVar35 = (this->compilationUnits).
               super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppCVar36 = (this->compilationUnits).
               super__Vector_base<const_slang::ast::CompilationUnitSymbol_*,_std::allocator<const_slang::ast::CompilationUnitSymbol_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pRVar100 = (this->root)._M_t.
               super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
               .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    (pRVar100->compilationUnits)._M_ptr = ppCVar35;
    (pRVar100->compilationUnits)._M_extent._M_extent_value = (long)ppCVar36 - (long)ppCVar35 >> 3;
    this->finalized = true;
    this->finalizing = false;
    pRVar100 = (this->root)._M_t.
               super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
               ._M_t.
               super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
               .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    if ((DefinitionSymbol *)local_158._0_8_ != (DefinitionSymbol *)&local_140) {
      operator_delete((void *)local_158._0_8_);
    }
    if (local_98.
        super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
        .data_ != (pointer)local_98.
                           super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                           .firstElement) {
      operator_delete(local_98.
                      super_SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_slang::SourceRange>_>
                      .data_);
    }
    this->finalizing = false;
    if (ppStack_1a8 != (value_type_pointer)0x0) {
      operator_delete(ppStack_1a8,((local_1c0._8_8_ * 0x178 + 0x186U) / 3 & 0xfffffffffffffff8) * 3)
      ;
    }
  }
  return pRVar100;
LAB_002e4bfb:
  do {
    auVar111[0] = -(*paVar63 == (anon_class_1_0_00000001)0x0);
    auVar111[1] = -(paVar63[1] == (anon_class_1_0_00000001)0x0);
    auVar111[2] = -(paVar63[2] == (anon_class_1_0_00000001)0x0);
    auVar111[3] = -(paVar63[3] == (anon_class_1_0_00000001)0x0);
    auVar111[4] = -(paVar63[4] == (anon_class_1_0_00000001)0x0);
    auVar111[5] = -(paVar63[5] == (anon_class_1_0_00000001)0x0);
    auVar111[6] = -(paVar63[6] == (anon_class_1_0_00000001)0x0);
    auVar111[7] = -(paVar63[7] == (anon_class_1_0_00000001)0x0);
    auVar111[8] = -(paVar63[8] == (anon_class_1_0_00000001)0x0);
    auVar111[9] = -(paVar63[9] == (anon_class_1_0_00000001)0x0);
    auVar111[10] = -(paVar63[10] == (anon_class_1_0_00000001)0x0);
    auVar111[0xb] = -(paVar63[0xb] == (anon_class_1_0_00000001)0x0);
    auVar111[0xc] = -(paVar63[0xc] == (anon_class_1_0_00000001)0x0);
    auVar111[0xd] = -(paVar63[0xd] == (anon_class_1_0_00000001)0x0);
    auVar111[0xe] = -(paVar63[0xe] == (anon_class_1_0_00000001)0x0);
    auVar111[0xf] = -(paVar63[0xf] == (anon_class_1_0_00000001)0x0);
    uVar78 = (uint)(ushort)((ushort)(SUB161(auVar111 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar111 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar111 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar111 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar111 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar111 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar111 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar111 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar111 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar111 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar111 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar111 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar111 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar111 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar111 >> 0x77,0) & 1) << 0xe);
    if (uVar78 == 0x7fff) {
      paVar63 = paVar63 + 0x10;
      pbVar104 = pbVar104 + 0xf;
    }
    else {
      uVar37 = 0;
      if ((uVar78 ^ 0x7fff) != 0) {
        for (; ((uVar78 ^ 0x7fff) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
        }
      }
      if (paVar63[uVar37] == (anon_class_1_0_00000001)0x1) {
        pbVar104 = (table_element_pointer)0x0;
      }
      else {
        paVar63 = paVar63 + uVar37;
        pbVar104 = (table_element_pointer)((long)&pbVar104->_M_len + (ulong)(uVar37 << 4));
      }
    }
  } while (uVar78 == 0x7fff);
LAB_002e4ba7:
  iVar128.p_ = pbVar104;
  iVar128.pc_ = (char_pointer)paVar63;
  if (pbVar104 == (table_element_pointer)0x0) goto LAB_002e4c52;
  goto LAB_002e4286;
LAB_002e4f21:
  do {
    auVar113[0] = -(*puVar99 == '\0');
    auVar113[1] = -(puVar99[1] == '\0');
    auVar113[2] = -(puVar99[2] == '\0');
    auVar113[3] = -(puVar99[3] == '\0');
    auVar113[4] = -(puVar99[4] == '\0');
    auVar113[5] = -(puVar99[5] == '\0');
    auVar113[6] = -(puVar99[6] == '\0');
    auVar113[7] = -(puVar99[7] == '\0');
    auVar113[8] = -(puVar99[8] == '\0');
    auVar113[9] = -(puVar99[9] == '\0');
    auVar113[10] = -(puVar99[10] == '\0');
    auVar113[0xb] = -(puVar99[0xb] == '\0');
    auVar113[0xc] = -(puVar99[0xc] == '\0');
    auVar113[0xd] = -(puVar99[0xd] == '\0');
    auVar113[0xe] = -(puVar99[0xe] == '\0');
    auVar113[0xf] = -(puVar99[0xf] == '\0');
    uVar78 = (uint)(ushort)((ushort)(SUB161(auVar113 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar113 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar113 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar113 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar113 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar113 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar113 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar113 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar113 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar113 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar113 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar113 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar113 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar113 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar113 >> 0x77,0) & 1) << 0xe);
    if (uVar78 == 0x7fff) {
      puVar99 = puVar99 + 0x10;
      ppVar76 = ppVar76 + 0xf;
      paVar63 = (anon_class_1_0_00000001 *)(ulong)uVar78;
    }
    else {
      uVar37 = 0;
      if ((uVar78 ^ 0x7fff) != 0) {
        for (; ((uVar78 ^ 0x7fff) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
        }
      }
      paVar63 = (anon_class_1_0_00000001 *)(ulong)uVar37;
      if (puVar99[(long)paVar63] == '\x01') {
        ppVar76 = (table_element_pointer)0x0;
      }
      else {
        puVar99 = puVar99 + (long)paVar63;
        ppVar76 = ppVar76 + (long)paVar63;
        paVar63 = (anon_class_1_0_00000001 *)((long)paVar63 * 0x38);
      }
    }
  } while (uVar78 == 0x7fff);
LAB_002e4cd8:
  iVar129.p_ = ppVar73;
  iVar129.pc_ = puVar99;
  if (ppVar76 == (table_element_pointer)0x0) goto LAB_002e4f7a;
  goto LAB_002e4c8b;
LAB_002e5554:
  do {
    auVar116[0] = -(*puVar99 == '\0');
    auVar116[1] = -(puVar99[1] == '\0');
    auVar116[2] = -(puVar99[2] == '\0');
    auVar116[3] = -(puVar99[3] == '\0');
    auVar116[4] = -(puVar99[4] == '\0');
    auVar116[5] = -(puVar99[5] == '\0');
    auVar116[6] = -(puVar99[6] == '\0');
    auVar116[7] = -(puVar99[7] == '\0');
    auVar116[8] = -(puVar99[8] == '\0');
    auVar116[9] = -(puVar99[9] == '\0');
    auVar116[10] = -(puVar99[10] == '\0');
    auVar116[0xb] = -(puVar99[0xb] == '\0');
    auVar116[0xc] = -(puVar99[0xc] == '\0');
    auVar116[0xd] = -(puVar99[0xd] == '\0');
    auVar116[0xe] = -(puVar99[0xe] == '\0');
    auVar116[0xf] = -(puVar99[0xf] == '\0');
    uVar78 = (uint)(ushort)((ushort)(SUB161(auVar116 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar116 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar116 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar116 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar116 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar116 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar116 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar116 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar116 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar116 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar116 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar116 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar116 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar116 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar116 >> 0x77,0) & 1) << 0xe);
    if (uVar78 == 0x7fff) {
      puVar99 = puVar99 + 0x10;
      ppVar76 = ppVar76 + 0xf;
      paVar63 = (anon_class_1_0_00000001 *)(ulong)uVar78;
    }
    else {
      uVar37 = 0;
      if ((uVar78 ^ 0x7fff) != 0) {
        for (; ((uVar78 ^ 0x7fff) >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
        }
      }
      paVar63 = (anon_class_1_0_00000001 *)(ulong)uVar37;
      if (puVar99[(long)paVar63] == '\x01') {
        ppVar76 = (table_element_pointer)0x0;
      }
      else {
        puVar99 = puVar99 + (long)paVar63;
        ppVar76 = ppVar76 + (long)paVar63;
        paVar63 = (anon_class_1_0_00000001 *)((long)paVar63 * 0x38);
      }
    }
  } while (uVar78 == 0x7fff);
LAB_002e5056:
  iVar130.p_ = ppVar73;
  iVar130.pc_ = puVar99;
  if (ppVar76 == (table_element_pointer)0x0) goto LAB_002e55ad;
  goto LAB_002e5009;
}

Assistant:

const RootSymbol& Compilation::getRoot(bool skipDefParamsAndBinds) {
    if (finalized)
        return *root;

    SLANG_ASSERT(!isFrozen());

    // Resolve default lib list now that we have all syntax trees added.
    defaultLiblist.reserve(options.defaultLiblist.size());
    for (auto& libName : options.defaultLiblist) {
        if (auto lib = getSourceLibrary(libName))
            defaultLiblist.push_back(lib);
    }

    // If any top-level parameter overrides were provided, parse them now.
    flat_hash_map<std::string_view, const ConstantValue*> cliOverrides;
    parseParamOverrides(cliOverrides);

    // If there are defparams we need to fully resolve their values up front before
    // we start elaborating any instances.
    if (!skipDefParamsAndBinds) {
        for (auto& tree : syntaxTrees) {
            auto& meta = tree->getMetadata();
            if (meta.hasDefparams || meta.hasBindDirectives) {
                resolveDefParamsAndBinds();
                break;
            }
        }
    }

    SLANG_ASSERT(!finalizing);
    finalizing = true;
    auto guard = ScopeGuard([this] { finalizing = false; });

    auto isValidTop = [&](auto& definition) {
        // All parameters must have defaults.
        for (auto& param : definition.parameters) {
            if (!param.hasDefault() &&
                (param.isTypeParam || cliOverrides.find(param.name) == cliOverrides.end())) {
                return false;
            }
        }
        return true;
    };

    // Find top level modules (and programs) that form the root of the design.
    // Iterate the definitions map before instantiating any top level modules,
    // since that can cause changes to the definition map itself.
    SmallVector<std::pair<DefinitionLookupResult, SourceRange>> topDefs;
    if (options.topModules.empty()) {
        for (auto& [key, defList] : definitionMap) {
            if (std::get<1>(key) != root.get())
                continue;

            for (auto defSym : defList.first) {
                // Ignore definitions that are not top level. Top level definitions are:
                // - Modules and programs
                // - Not nested
                // - Have no non-defaulted parameters
                // - Not instantiated anywhere
                // - Not in a library
                if (defSym->kind != SymbolKind::Definition)
                    continue;

                auto& def = defSym->as<DefinitionSymbol>();
                if (!def.sourceLibrary.isDefault ||
                    globalInstantiations.find(def.name) != globalInstantiations.end()) {
                    continue;
                }

                // Library definitions are never automatically instantiated in any capacity.
                if (!def.syntaxTree || !def.syntaxTree->isLibraryUnit) {
                    if (def.definitionKind == DefinitionKind::Module ||
                        def.definitionKind == DefinitionKind::Program) {
                        if (isValidTop(def)) {
                            // This definition can be automatically instantiated.
                            topDefs.push_back({{&def}, {}});
                            continue;
                        }
                    }
                }

                // Otherwise this definition is unreferenced and not automatically instantiated.
                unreferencedDefs.push_back(&def);
            }
        }
    }
    else {
        SmallMap<std::string_view, size_t, 4> topNameMap;
        auto tryAddTop = [&](DefinitionLookupResult result, SourceRange sourceRange) {
            // Make sure this definition's name doesn't collide with a top
            // module we already previously selected.
            auto def = result.definition;
            auto [it, inserted] = topNameMap.emplace(def->name, topDefs.size());
            if (inserted) {
                topDefs.push_back({result, sourceRange});
                SLANG_ASSERT(def->kind == SymbolKind::Definition);
                def->as<DefinitionSymbol>().noteInstantiated();
            }
            else {
                auto& diag = root->addDiag(diag::MultipleTopDupName, sourceRange.start()
                                                                         ? sourceRange
                                                                         : SourceRange::NoLocation);
                diag << def->name;

                auto& entry = topDefs[it->second];
                if (entry.first.configRoot)
                    diag.addNote(diag::NoteConfigRule, entry.second);
            }
        };

        // If the list of top modules has already been provided we just need to
        // find and instantiate them.
        for (auto userProvidedName : options.topModules) {
            // Find the target library, if there is one specified.
            auto searchName = userProvidedName;
            const SourceLibrary* targetLib = nullptr;
            if (auto idx = searchName.find('.'); idx != std::string_view::npos) {
                targetLib = getSourceLibrary(searchName.substr(0, idx));
                if (!targetLib) {
                    root->addDiag(diag::InvalidTopModule, SourceLocation::NoLocation)
                        << userProvidedName;
                    continue;
                }

                searchName = searchName.substr(idx + 1);
            }

            // A trailing ':config' is stripped -- it's there to allow the user
            // to disambiguate modules and config blocks.
            bool onlyConfig = false;
            constexpr std::string_view configSuffix = ":config";
            if (searchName.ends_with(configSuffix)) {
                onlyConfig = true;
                searchName = searchName.substr(0, searchName.length() - configSuffix.length());
            }

            if (!onlyConfig) {
                if (auto defIt = definitionMap.find(std::tuple{searchName, root.get()});
                    defIt != definitionMap.end()) {

                    const DefinitionSymbol* foundDef = nullptr;
                    for (auto defSym : defIt->second.first) {
                        if (defSym->kind != SymbolKind::Definition)
                            continue;

                        auto& def = defSym->as<DefinitionSymbol>();
                        if (&def.sourceLibrary == targetLib ||
                            (!targetLib && def.sourceLibrary.isDefault)) {
                            foundDef = &def;
                            break;
                        }
                    }

                    if (foundDef) {
                        if ((foundDef->definitionKind == DefinitionKind::Module ||
                             foundDef->definitionKind == DefinitionKind::Program) &&
                            isValidTop(*foundDef)) {

                            tryAddTop({foundDef}, {});
                        }
                        else {
                            // Otherwise, issue an error because the user asked us to instantiate
                            // this.
                            foundDef->getParentScope()->addDiag(diag::InvalidTopModule,
                                                                SourceLocation::NoLocation)
                                << userProvidedName;
                        }
                        continue;
                    }
                }
            }

            if (auto confIt = configBlocks.find(searchName); confIt != configBlocks.end()) {
                const ConfigBlockSymbol* foundConf = nullptr;
                for (auto conf : confIt->second) {
                    auto lib = conf->getSourceLibrary();
                    SLANG_ASSERT(lib);

                    if (lib == targetLib || (!targetLib && lib->isDefault)) {
                        foundConf = conf;
                        break;
                    }
                }

                if (foundConf) {
                    foundConf->isUsed = true;
                    for (auto& cell : foundConf->getTopCells())
                        tryAddTop({&cell.definition, foundConf, cell.rule}, cell.sourceRange);
                    continue;
                }
            }

            root->addDiag(diag::InvalidTopModule, SourceLocation::NoLocation) << userProvidedName;
        }

        // Go back through the definition map and find all definitions that are unused,
        // unreferenced in the design, and candidates for instantiating in unreferenced
        // form to get some error checking of their contents.
        for (auto& [key, defList] : definitionMap) {
            if (std::get<1>(key) != root.get())
                continue;

            for (auto defSym : defList.first) {
                if (defSym->kind != SymbolKind::Definition)
                    continue;

                auto& def = defSym->as<DefinitionSymbol>();
                if (globalInstantiations.find(def.name) == globalInstantiations.end() &&
                    def.sourceLibrary.isDefault && def.getInstanceCount() == 0) {
                    unreferencedDefs.push_back(&def);
                }
            }
        }
    }

    // Sort the list of definitions so that we get deterministic ordering of instances;
    // the order is otherwise dependent on iterating over a hash table.
    std::ranges::sort(topDefs, [](auto a, auto b) {
        return a.first.definition->name < b.first.definition->name;
    });
    std::ranges::sort(unreferencedDefs, [](auto a, auto b) { return a->name < b->name; });

    // If we have any cli param overrides we should apply them to
    // each top-level instance.
    // TODO: generalize these to full hierarchical paths
    if (!cliOverrides.empty()) {
        for (auto [result, _] : topDefs) {
            auto& def = result.definition->as<DefinitionSymbol>();
            for (auto& param : def.parameters) {
                if (!param.isTypeParam && param.hasSyntax) {
                    auto it = cliOverrides.find(param.name);
                    if (it != cliOverrides.end()) {
                        hierarchyOverrides.childNodes[*def.getSyntax()].paramOverrides.emplace(
                            param.valueDecl, std::pair{*it->second, nullptr});
                    }
                }
            }
        }
    }

    SmallVector<const InstanceSymbol*> topList;
    for (auto [result, _] : topDefs) {
        auto& def = result.definition->as<DefinitionSymbol>();
        HierarchyOverrideNode* hierarchyOverrideNode = nullptr;
        if (auto sit = hierarchyOverrides.childNodes.find(*def.getSyntax());
            sit != hierarchyOverrides.childNodes.end()) {
            hierarchyOverrideNode = &sit->second;
        }

        auto& instance = InstanceSymbol::createDefault(*this, def, hierarchyOverrideNode,
                                                       result.configRoot, result.configRule);
        root->addMember(instance);
        topList.push_back(&instance);
    }

    if (!hasFlag(CompilationFlags::LintMode | CompilationFlags::AllowTopLevelIfacePorts) &&
        topDefs.empty()) {
        root->addDiag(diag::NoTopModules, SourceLocation::NoLocation);
    }

    // For unreferenced definitions, go through and instantiate them with all empty
    // parameter values so that we get at least some semantic checking of the contents.
    for (auto def : unreferencedDefs)
        root->addMember(InstanceSymbol::createInvalid(*this, *def));

    root->topInstances = topList.copy(*this);
    root->compilationUnits = compilationUnits;
    finalizing = false;
    finalized = true;

    return *root;
}